

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

int dedotdotify(char *input,size_t clen,char **outp)

{
  _Bool _Var1;
  void *pvVar2;
  size_t sVar3;
  char *pcVar4;
  char *last;
  char *ptr;
  size_t len;
  size_t blen_1;
  char *p_1;
  size_t blen;
  char *p;
  undefined1 local_48 [4];
  CURLcode result;
  dynbuf out;
  char **outp_local;
  size_t clen_local;
  char *input_local;
  
  p._4_4_ = CURLE_OK;
  *outp = (char *)0x0;
  if (clen < 2) {
    return 0;
  }
  out.toobig = (size_t)outp;
  outp_local = (char **)clen;
  clen_local = (size_t)input;
  Curl_dyn_init((dynbuf *)local_48,clen + 1);
  _Var1 = is_dot((char **)&clen_local,(size_t *)&outp_local);
  if (_Var1) {
    blen = clen_local;
    p_1 = (char *)outp_local;
    if (outp_local == (char **)0x0) goto LAB_001a7d97;
    if (*(char *)clen_local == '/') {
      clen_local = clen_local + 1;
      outp_local = (char **)((long)outp_local + -1);
    }
    else {
      _Var1 = is_dot((char **)&blen,(size_t *)&p_1);
      if (_Var1) {
        if (p_1 == (char *)0x0) goto LAB_001a7d97;
        if (*(char *)blen == '/') {
          clen_local = blen + 1;
          outp_local = (char **)(p_1 + -1);
        }
      }
    }
  }
  while (outp_local != (char **)0x0 && p._4_4_ == CURLE_OK) {
    if (*(char *)clen_local == '/') {
      blen_1 = clen_local + 1;
      len = (long)outp_local - 1;
      _Var1 = is_dot((char **)&blen_1,&len);
      if (!_Var1) goto LAB_001a7d63;
      if (len == 0) {
        p._4_4_ = Curl_dyn_addn((dynbuf *)local_48,"/",1);
        break;
      }
      if (*(char *)blen_1 == '/') {
        clen_local = blen_1;
        outp_local = (char **)len;
      }
      else {
        _Var1 = is_dot((char **)&blen_1,&len);
        if ((!_Var1) || ((*(char *)blen_1 != '/' && (len != 0)))) goto LAB_001a7d63;
        sVar3 = Curl_dyn_len((dynbuf *)local_48);
        if (sVar3 != 0) {
          pcVar4 = Curl_dyn_ptr((dynbuf *)local_48);
          pvVar2 = memrchr(pcVar4,0x2f,sVar3);
          if (pvVar2 != (void *)0x0) {
            Curl_dyn_setlen((dynbuf *)local_48,(long)pvVar2 - (long)pcVar4);
          }
        }
        if (len == 0) {
          p._4_4_ = Curl_dyn_addn((dynbuf *)local_48,"/",1);
          break;
        }
        clen_local = blen_1;
        outp_local = (char **)len;
      }
    }
    else {
LAB_001a7d63:
      p._4_4_ = Curl_dyn_addn((dynbuf *)local_48,(void *)clen_local,1);
      clen_local = clen_local + 1;
      outp_local = (char **)((long)outp_local + -1);
    }
  }
LAB_001a7d97:
  if (p._4_4_ == CURLE_OK) {
    sVar3 = Curl_dyn_len((dynbuf *)local_48);
    if (sVar3 == 0) {
      pcVar4 = (*Curl_cstrdup)("");
      *(char **)out.toobig = pcVar4;
      if (*(long *)out.toobig == 0) {
        return 1;
      }
    }
    else {
      pcVar4 = Curl_dyn_ptr((dynbuf *)local_48);
      *(char **)out.toobig = pcVar4;
    }
  }
  return (uint)(p._4_4_ != CURLE_OK);
}

Assistant:

UNITTEST int dedotdotify(const char *input, size_t clen, char **outp)
{
  struct dynbuf out;
  CURLcode result = CURLE_OK;

  *outp = NULL;
  /* the path always starts with a slash, and a slash has not dot */
  if(clen < 2)
    return 0;

  Curl_dyn_init(&out, clen + 1);

  /*  A. If the input buffer begins with a prefix of "../" or "./", then
      remove that prefix from the input buffer; otherwise, */
  if(is_dot(&input, &clen)) {
    const char *p = input;
    size_t blen = clen;

    if(!clen)
      /* . [end] */
      goto end;
    else if(ISSLASH(*p)) {
      /* one dot followed by a slash */
      input = p + 1;
      clen--;
    }

    /*  D. if the input buffer consists only of "." or "..", then remove
        that from the input buffer; otherwise, */
    else if(is_dot(&p, &blen)) {
      if(!blen)
        /* .. [end] */
        goto end;
      else if(ISSLASH(*p)) {
        /* ../ */
        input = p + 1;
        clen = blen - 1;
      }
    }
  }

  while(clen && !result) { /* until end of path content */
    if(ISSLASH(*input)) {
      const char *p = &input[1];
      size_t blen = clen - 1;
      /*  B. if the input buffer begins with a prefix of "/./" or "/.", where
          "."  is a complete path segment, then replace that prefix with "/" in
          the input buffer; otherwise, */
      if(is_dot(&p, &blen)) {
        if(!blen) { /* /. */
          result = Curl_dyn_addn(&out, "/", 1);
          break;
        }
        else if(ISSLASH(*p)) { /* /./ */
          input = p;
          clen = blen;
          continue;
        }

        /*  C. if the input buffer begins with a prefix of "/../" or "/..",
            where ".." is a complete path segment, then replace that prefix
            with "/" in the input buffer and remove the last segment and its
            preceding "/" (if any) from the output buffer; otherwise, */
        else if(is_dot(&p, &blen) && (ISSLASH(*p) || !blen)) {
          /* remove the last segment from the output buffer */
          size_t len = Curl_dyn_len(&out);
          if(len) {
            char *ptr = Curl_dyn_ptr(&out);
            char *last = memrchr(ptr, '/', len);
            if(last)
              /* trim the output at the slash */
              Curl_dyn_setlen(&out, last - ptr);
          }

          if(blen) { /* /../ */
            input = p;
            clen = blen;
            continue;
          }
          result = Curl_dyn_addn(&out, "/", 1);
          break;
        }
      }
    }

    /*  E. move the first path segment in the input buffer to the end of
        the output buffer, including the initial "/" character (if any) and
        any subsequent characters up to, but not including, the next "/"
        character or the end of the input buffer. */

    result = Curl_dyn_addn(&out, input, 1);
    input++;
    clen--;
  }
end:
  if(!result) {
    if(Curl_dyn_len(&out))
      *outp = Curl_dyn_ptr(&out);
    else {
      *outp = strdup("");
      if(!*outp)
        return 1;
    }
  }
  return result ? 1 : 0; /* success */
}